

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pdu.cc
# Opt level: O2

void __thiscall assembler::SessionPDU::SessionPDU(SessionPDU *this,int vcid,int apid)

{
  _Rb_tree_header *p_Var1;
  
  this->vcid = vcid;
  this->apid = apid;
  (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->m_)._M_t._M_impl.super__Rb_tree_header;
  (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->lastSequenceCount_ = 0;
  (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->remainingHeaderBytes_ = 0;
  (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->szParam_)._M_t.super___uniq_ptr_impl<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_>._M_t.
  super__Tuple_impl<0UL,_SZ_com_t_s_*,_std::default_delete<SZ_com_t_s>_>.
  super__Head_base<0UL,_SZ_com_t_s_*,_false>._M_head_impl = (SZ_com_t_s *)0x0;
  (this->szTmp_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->szTmp_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->szTmp_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->linesDone_ = 0;
  return;
}

Assistant:

SessionPDU::SessionPDU(int vcid, int apid)
  : vcid(vcid),
    apid(apid),
    remainingHeaderBytes_(0),
    lastSequenceCount_(0),
    linesDone_(0) {
}